

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwapChainVkImpl.cpp
# Opt level: O0

void __thiscall Diligent::SwapChainVkImpl::InitBuffersAndViews(SwapChainVkImpl *this)

{
  VkSwapchainKHR pVVar1;
  VkImage vkImgHandle;
  PFN_vkGetSwapchainImagesKHR p_Var2;
  VkResult errorCode;
  int iVar3;
  RenderDeviceVkImpl *pRVar4;
  VkDevice pVVar5;
  Char *pCVar6;
  size_type __new_size;
  ulong __n;
  VkImage_T **ppVVar7;
  char (*pacVar8) [46];
  char (*Args_1) [46];
  ostream *this_00;
  reference ppVVar9;
  TextureVkImpl **ppTexture;
  TextureVkImpl *this_01;
  ITextureView **ppView;
  IObject *pObj;
  reference this_02;
  IRenderDevice *pIVar10;
  ITexture **ppIVar11;
  ITexture *pIVar12;
  undefined4 extraout_var;
  char (*Args_1_00) [18];
  RefCntAutoPtr<Diligent::ITextureViewVk> local_3a0;
  IObject *local_398;
  ITextureView *pDSV;
  RefCntAutoPtr<Diligent::ITexture> local_380;
  RefCntAutoPtr<Diligent::ITexture> pDepthBufferTex;
  TextureDesc DepthBufferDesc;
  DoublePtrHelper<Diligent::ITextureView> local_320;
  RefCntAutoPtr<Diligent::ITextureView> local_310;
  RefCntAutoPtr<Diligent::ITextureView> pRTV;
  TextureViewDesc RTVDesc;
  RefCntAutoPtr<Diligent::TextureVkImpl> local_2d0;
  RefCntAutoPtr<Diligent::TextureVkImpl> pBackBufferTex;
  string name;
  stringstream name_ss;
  ostream local_298 [376];
  undefined1 local_120 [8];
  TextureDesc BackBufferDesc;
  undefined1 local_c8 [4];
  uint32_t i;
  string msg_2;
  allocator<VkImage_T_*> local_99;
  VkResult err;
  vector<VkImage_T_*,_std::allocator<VkImage_T_*>_> swapchainImages;
  undefined1 local_78 [4];
  uint32_t swapchainImageCount;
  string msg_1;
  undefined1 local_48 [8];
  string msg;
  VkResult err_1;
  uint32_t swapchainImageCount_1;
  VkDevice LogicalVkDevice;
  RenderDeviceVkImpl *pDeviceVkImpl;
  SwapChainVkImpl *this_local;
  
  pRVar4 = RefCntAutoPtr<Diligent::IRenderDevice>::RawPtr<Diligent::RenderDeviceVkImpl>
                     (&(this->super_SwapChainBase<Diligent::ISwapChainVk>).m_pRenderDevice);
  pVVar5 = RenderDeviceVkImpl::GetVkDevice(pRVar4);
  msg.field_2._12_4_ = 0;
  Args_1_00 = (char (*) [18])0x0;
  msg.field_2._8_4_ =
       (*vkGetSwapchainImagesKHR)
                 (pVVar5,this->m_VkSwapChain,(uint32_t *)(msg.field_2._M_local_buf + 0xc),
                  (VkImage *)0x0);
  if (msg.field_2._8_4_ != VK_SUCCESS) {
    FormatString<char[26],char[18]>
              ((string *)local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"err == VK_SUCCESS",Args_1_00);
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar6,"InitBuffersAndViews",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
               ,0x21c);
    std::__cxx11::string::~string((string *)local_48);
  }
  if (msg.field_2._12_4_ !=
      (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.BufferCount) {
    FormatString<char[35]>((string *)local_78,(char (*) [35])"Unexpected swap chain buffer count");
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar6,"InitBuffersAndViews",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
               ,0x21d);
    std::__cxx11::string::~string((string *)local_78);
  }
  std::
  vector<Diligent::RefCntAutoPtr<Diligent::ITextureViewVk>,_Diligent::STDAllocator<Diligent::RefCntAutoPtr<Diligent::ITextureViewVk>,_Diligent::IMemoryAllocator>_>
  ::resize(&this->m_pBackBufferRTV,
           (ulong)(this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.BufferCount);
  __new_size = std::
               vector<Diligent::RefCntAutoPtr<Diligent::ITextureViewVk>,_Diligent::STDAllocator<Diligent::RefCntAutoPtr<Diligent::ITextureViewVk>,_Diligent::IMemoryAllocator>_>
               ::size(&this->m_pBackBufferRTV);
  std::vector<bool,_Diligent::STDAllocator<bool,_Diligent::IMemoryAllocator>_>::resize
            (&this->m_SwapChainImagesInitialized,__new_size,false);
  swapchainImages.super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ =
       (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.BufferCount;
  __n = (ulong)swapchainImages.super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>._M_impl
               .super__Vector_impl_data._M_end_of_storage._4_4_;
  std::allocator<VkImage_T_*>::allocator(&local_99);
  std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>::vector
            ((vector<VkImage_T_*,_std::allocator<VkImage_T_*>_> *)&err,__n,&local_99);
  std::allocator<VkImage_T_*>::~allocator(&local_99);
  p_Var2 = vkGetSwapchainImagesKHR;
  pVVar1 = this->m_VkSwapChain;
  ppVVar7 = std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>::data
                      ((vector<VkImage_T_*,_std::allocator<VkImage_T_*>_> *)&err);
  errorCode = (*p_Var2)(pVVar5,pVVar1,
                        (uint32_t *)
                        ((long)&swapchainImages.
                                super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage + 4),ppVVar7);
  if (errorCode != VK_SUCCESS) {
    msg_2.field_2._8_8_ = VulkanUtilities::VkResultToString(errorCode);
    LogError<true,char[32],char[17],char_const*>
              (false,"InitBuffersAndViews",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
               ,0x227,(char (*) [32])"Failed to get swap chain images",
               (char (*) [17])"\nVK Error Code: ",(char **)((long)&msg_2.field_2 + 8));
  }
  pacVar8 = (char (*) [46])
            (ulong)swapchainImages.super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  Args_1 = (char (*) [46])
           std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>::size
                     ((vector<VkImage_T_*,_std::allocator<VkImage_T_*>_> *)&err);
  if (pacVar8 != Args_1) {
    FormatString<char[26],char[46]>
              ((string *)local_c8,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"swapchainImageCount == swapchainImages.size()",Args_1);
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar6,"InitBuffersAndViews",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
               ,0x228);
    std::__cxx11::string::~string((string *)local_c8);
  }
  for (BackBufferDesc.ImmediateContextMask._4_4_ = 0;
      BackBufferDesc.ImmediateContextMask._4_4_ <
      swapchainImages.super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_;
      BackBufferDesc.ImmediateContextMask._4_4_ = BackBufferDesc.ImmediateContextMask._4_4_ + 1) {
    TextureDesc::TextureDesc((TextureDesc *)local_120);
    std::__cxx11::stringstream::stringstream((stringstream *)(name.field_2._M_local_buf + 8));
    this_00 = std::operator<<(local_298,"Main back buffer ");
    std::ostream::operator<<(this_00,BackBufferDesc.ImmediateContextMask._4_4_);
    std::__cxx11::stringstream::str();
    local_120 = (undefined1  [8])std::__cxx11::string::c_str();
    BackBufferDesc.super_DeviceObjectAttribs.Name._0_1_ = 4;
    BackBufferDesc.super_DeviceObjectAttribs.Name._4_4_ =
         (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.Width;
    BackBufferDesc._8_4_ =
         (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.Height;
    BackBufferDesc.Height._0_2_ =
         (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.ColorBufferFormat;
    BackBufferDesc.MipLevels =
         SwapChainUsageFlagsToBindFlags
                   ((this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.Usage);
    BackBufferDesc.field_3.ArraySize = 1;
    RefCntAutoPtr<Diligent::TextureVkImpl>::RefCntAutoPtr(&local_2d0);
    pRVar4 = RefCntAutoPtr<Diligent::IRenderDevice>::RawPtr<Diligent::RenderDeviceVkImpl>
                       (&(this->super_SwapChainBase<Diligent::ISwapChainVk>).m_pRenderDevice);
    ppVVar9 = std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>::operator[]
                        ((vector<VkImage_T_*,_std::allocator<VkImage_T_*>_> *)&err,
                         (ulong)BackBufferDesc.ImmediateContextMask._4_4_);
    vkImgHandle = *ppVVar9;
    RefCntAutoPtr<Diligent::TextureVkImpl>::operator&
              ((RefCntAutoPtr<Diligent::TextureVkImpl> *)&RTVDesc.Swizzle.B);
    ppTexture = Diligent::RefCntAutoPtr::DoublePtrHelper::operator_cast_to_TextureVkImpl__
                          ((DoublePtrHelper *)&RTVDesc.Swizzle.B);
    RenderDeviceVkImpl::CreateTexture
              (pRVar4,(TextureDesc *)local_120,vkImgHandle,RESOURCE_STATE_UNDEFINED,ppTexture);
    RefCntAutoPtr<Diligent::TextureVkImpl>::DoublePtrHelper<Diligent::TextureVkImpl>::
    ~DoublePtrHelper((DoublePtrHelper<Diligent::TextureVkImpl> *)&RTVDesc.Swizzle.B);
    TextureViewDesc::TextureViewDesc((TextureViewDesc *)&pRTV);
    RTVDesc.super_DeviceObjectAttribs.Name._0_1_ = 2;
    RefCntAutoPtr<Diligent::ITextureView>::RefCntAutoPtr(&local_310);
    this_01 = RefCntAutoPtr<Diligent::TextureVkImpl>::operator->(&local_2d0);
    RefCntAutoPtr<Diligent::ITextureView>::operator&
              ((RefCntAutoPtr<Diligent::ITextureView> *)&local_320);
    ppView = Diligent::RefCntAutoPtr::DoublePtrHelper::operator_cast_to_ITextureView__
                       ((DoublePtrHelper *)&local_320);
    TextureBase<Diligent::EngineVkImplTraits>::CreateView
              (&this_01->super_TextureBase<Diligent::EngineVkImplTraits>,(TextureViewDesc *)&pRTV,
               ppView);
    RefCntAutoPtr<Diligent::ITextureView>::DoublePtrHelper<Diligent::ITextureView>::~DoublePtrHelper
              (&local_320);
    pObj = (IObject *)
           Diligent::RefCntAutoPtr::operator_cast_to_ITextureView_((RefCntAutoPtr *)&local_310);
    RefCntAutoPtr<Diligent::ITextureViewVk>::RefCntAutoPtr
              ((RefCntAutoPtr<Diligent::ITextureViewVk> *)&DepthBufferDesc.ImmediateContextMask,pObj
               ,(INTERFACE_ID *)IID_TextureViewVk);
    this_02 = std::
              vector<Diligent::RefCntAutoPtr<Diligent::ITextureViewVk>,_Diligent::STDAllocator<Diligent::RefCntAutoPtr<Diligent::ITextureViewVk>,_Diligent::IMemoryAllocator>_>
              ::operator[](&this->m_pBackBufferRTV,(ulong)BackBufferDesc.ImmediateContextMask._4_4_)
    ;
    RefCntAutoPtr<Diligent::ITextureViewVk>::operator=
              (this_02,(RefCntAutoPtr<Diligent::ITextureViewVk> *)
                       &DepthBufferDesc.ImmediateContextMask);
    RefCntAutoPtr<Diligent::ITextureViewVk>::~RefCntAutoPtr
              ((RefCntAutoPtr<Diligent::ITextureViewVk> *)&DepthBufferDesc.ImmediateContextMask);
    RefCntAutoPtr<Diligent::ITextureView>::~RefCntAutoPtr(&local_310);
    RefCntAutoPtr<Diligent::TextureVkImpl>::~RefCntAutoPtr(&local_2d0);
    std::__cxx11::string::~string((string *)&pBackBufferTex);
    std::__cxx11::stringstream::~stringstream((stringstream *)(name.field_2._M_local_buf + 8));
  }
  if ((this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.DepthBufferFormat !=
      TEX_FORMAT_UNKNOWN) {
    TextureDesc::TextureDesc((TextureDesc *)&pDepthBufferTex);
    DepthBufferDesc.super_DeviceObjectAttribs.Name._0_1_ = 4;
    DepthBufferDesc.super_DeviceObjectAttribs.Name._4_4_ =
         (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.Width;
    DepthBufferDesc._8_4_ =
         (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.Height;
    DepthBufferDesc.Height._0_2_ =
         (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.DepthBufferFormat;
    DepthBufferDesc.Format = TEX_FORMAT_RGBA32_TYPELESS;
    DepthBufferDesc._26_2_ = 0;
    DepthBufferDesc.SampleCount._0_1_ = 1;
    DepthBufferDesc.MipLevels = 0x40;
    DepthBufferDesc.ClearValue.Color[2] =
         (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.DefaultDepthValue;
    DepthBufferDesc.ClearValue.Color[3]._0_1_ =
         (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.DefaultStencilValue;
    pDepthBufferTex.m_pObject = (ITexture *)anon_var_dwarf_381b50;
    DepthBufferDesc.BindFlags._0_2_ = (TEXTURE_FORMAT)DepthBufferDesc.Height;
    RefCntAutoPtr<Diligent::ITexture>::RefCntAutoPtr(&local_380);
    pIVar10 = RefCntAutoPtr<Diligent::IRenderDevice>::operator->
                        (&(this->super_SwapChainBase<Diligent::ISwapChainVk>).m_pRenderDevice);
    RefCntAutoPtr<Diligent::ITexture>::operator&((RefCntAutoPtr<Diligent::ITexture> *)&pDSV);
    ppIVar11 = Diligent::RefCntAutoPtr::DoublePtrHelper::operator_cast_to_ITexture__
                         ((DoublePtrHelper *)&pDSV);
    (*(pIVar10->super_IObject)._vptr_IObject[6])(pIVar10,&pDepthBufferTex,0,ppIVar11);
    RefCntAutoPtr<Diligent::ITexture>::DoublePtrHelper<Diligent::ITexture>::~DoublePtrHelper
              ((DoublePtrHelper<Diligent::ITexture> *)&pDSV);
    pIVar12 = RefCntAutoPtr<Diligent::ITexture>::operator->(&local_380);
    iVar3 = (*(pIVar12->super_IDeviceObject).super_IObject._vptr_IObject[9])(pIVar12,3);
    local_398 = (IObject *)CONCAT44(extraout_var,iVar3);
    RefCntAutoPtr<Diligent::ITextureViewVk>::RefCntAutoPtr
              (&local_3a0,local_398,(INTERFACE_ID *)IID_TextureViewVk);
    RefCntAutoPtr<Diligent::ITextureViewVk>::operator=(&this->m_pDepthBufferDSV,&local_3a0);
    RefCntAutoPtr<Diligent::ITextureViewVk>::~RefCntAutoPtr(&local_3a0);
    RefCntAutoPtr<Diligent::ITexture>::~RefCntAutoPtr(&local_380);
  }
  std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>::~vector
            ((vector<VkImage_T_*,_std::allocator<VkImage_T_*>_> *)&err);
  return;
}

Assistant:

void SwapChainVkImpl::InitBuffersAndViews()
{
    RenderDeviceVkImpl* pDeviceVkImpl   = m_pRenderDevice.RawPtr<RenderDeviceVkImpl>();
    VkDevice            LogicalVkDevice = pDeviceVkImpl->GetVkDevice();

#ifdef DILIGENT_DEBUG
    {
        uint32_t swapchainImageCount = 0;
        VkResult err                 = vkGetSwapchainImagesKHR(LogicalVkDevice, m_VkSwapChain, &swapchainImageCount, NULL);
        VERIFY_EXPR(err == VK_SUCCESS);
        VERIFY(swapchainImageCount == m_SwapChainDesc.BufferCount, "Unexpected swap chain buffer count");
    }
#endif

    m_pBackBufferRTV.resize(m_SwapChainDesc.BufferCount);
    m_SwapChainImagesInitialized.resize(m_pBackBufferRTV.size(), false);

    uint32_t             swapchainImageCount = m_SwapChainDesc.BufferCount;
    std::vector<VkImage> swapchainImages(swapchainImageCount);
    VkResult             err = vkGetSwapchainImagesKHR(LogicalVkDevice, m_VkSwapChain, &swapchainImageCount, swapchainImages.data());
    CHECK_VK_ERROR_AND_THROW(err, "Failed to get swap chain images");
    VERIFY_EXPR(swapchainImageCount == swapchainImages.size());

    for (uint32_t i = 0; i < swapchainImageCount; i++)
    {
        TextureDesc       BackBufferDesc;
        std::stringstream name_ss;
        name_ss << "Main back buffer " << i;
        const std::string name   = name_ss.str();
        BackBufferDesc.Name      = name.c_str();
        BackBufferDesc.Type      = RESOURCE_DIM_TEX_2D;
        BackBufferDesc.Width     = m_SwapChainDesc.Width;
        BackBufferDesc.Height    = m_SwapChainDesc.Height;
        BackBufferDesc.Format    = m_SwapChainDesc.ColorBufferFormat;
        BackBufferDesc.BindFlags = SwapChainUsageFlagsToBindFlags(m_SwapChainDesc.Usage);
        BackBufferDesc.MipLevels = 1;

        RefCntAutoPtr<TextureVkImpl> pBackBufferTex;
        m_pRenderDevice.RawPtr<RenderDeviceVkImpl>()->CreateTexture(BackBufferDesc, swapchainImages[i], RESOURCE_STATE_UNDEFINED, &pBackBufferTex);

        TextureViewDesc RTVDesc;
        RTVDesc.ViewType = TEXTURE_VIEW_RENDER_TARGET;
        RefCntAutoPtr<ITextureView> pRTV;
        pBackBufferTex->CreateView(RTVDesc, &pRTV);
        m_pBackBufferRTV[i] = RefCntAutoPtr<ITextureViewVk>(pRTV, IID_TextureViewVk);
    }

    if (m_SwapChainDesc.DepthBufferFormat != TEX_FORMAT_UNKNOWN)
    {
        TextureDesc DepthBufferDesc;
        DepthBufferDesc.Type        = RESOURCE_DIM_TEX_2D;
        DepthBufferDesc.Width       = m_SwapChainDesc.Width;
        DepthBufferDesc.Height      = m_SwapChainDesc.Height;
        DepthBufferDesc.Format      = m_SwapChainDesc.DepthBufferFormat;
        DepthBufferDesc.SampleCount = 1;
        DepthBufferDesc.Usage       = USAGE_DEFAULT;
        DepthBufferDesc.BindFlags   = BIND_DEPTH_STENCIL;

        DepthBufferDesc.ClearValue.Format               = DepthBufferDesc.Format;
        DepthBufferDesc.ClearValue.DepthStencil.Depth   = m_SwapChainDesc.DefaultDepthValue;
        DepthBufferDesc.ClearValue.DepthStencil.Stencil = m_SwapChainDesc.DefaultStencilValue;
        DepthBufferDesc.Name                            = "Main depth buffer";
        RefCntAutoPtr<ITexture> pDepthBufferTex;
        m_pRenderDevice->CreateTexture(DepthBufferDesc, nullptr, static_cast<ITexture**>(&pDepthBufferTex));
        ITextureView* pDSV = pDepthBufferTex->GetDefaultView(TEXTURE_VIEW_DEPTH_STENCIL);
        m_pDepthBufferDSV  = RefCntAutoPtr<ITextureViewVk>(pDSV, IID_TextureViewVk);
    }
}